

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

bool __thiscall
ObjectModelBuilder::buildReplicator(ObjectModelBuilder *this,object *object,Class *clazz)

{
  Value *this_00;
  const_iterator cVar1;
  double *pdVar2;
  ostream *poVar3;
  Class *clazz_00;
  bool bVar4;
  undefined1 local_1b8 [8];
  Replicator r;
  string parentName;
  Value v;
  string className;
  string id;
  
  findStringInObject((string *)local_1b8,object,"id");
  uniqueIdentifier((string *)((long)&className.field_2 + 8),this,clazz_00,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  findStringInObject((string *)&v.type,object,"class");
  if (className._M_dataplus._M_p == (pointer)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "error: \'replciator\' missing \'class\' tag, id=");
    poVar3 = std::operator<<(poVar3,(string *)(className.field_2._M_local_buf + 8));
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar4 = false;
    goto LAB_00112f5a;
  }
  findStringInObject((string *)((long)&r.terminator.field_2 + 8),object,"parent");
  if (parentName._M_dataplus._M_p == (pointer)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "error: \'replciator\' missing \'parent\' tag, id=");
    poVar3 = std::operator<<(poVar3,(string *)(className.field_2._M_local_buf + 8));
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar4 = false;
  }
  else {
    local_1b8 = (undefined1  [8])&r.id._M_string_length;
    r.id._M_dataplus._M_p = (pointer)0x0;
    r.id._M_string_length._0_1_ = 0;
    r.id.field_2._8_8_ = &r.clazz._M_string_length;
    r.clazz._M_dataplus._M_p = (pointer)0x0;
    r.clazz._M_string_length._0_1_ = 0;
    r.clazz.field_2._8_8_ = &r.parentId._M_string_length;
    r.parentId._M_dataplus._M_p = (pointer)0x0;
    r.parentId._M_string_length._0_1_ = 0;
    r.parentId.field_2._8_8_ = &r.count.stringValue._M_string_length;
    r.count.stringValue._M_dataplus._M_p = (pointer)0x0;
    r.count.stringValue._M_string_length._0_1_ = 0;
    r.count.numberValue = 0.0;
    r.count.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    r.count.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _0_4_ = 0;
    r.count._56_8_ = &r.initializor._M_string_length;
    r.initializor._M_dataplus._M_p = (pointer)0x0;
    r.initializor._M_string_length._0_1_ = 0;
    r.initializor.field_2._8_8_ = &r.terminator._M_string_length;
    r.terminator._M_dataplus._M_p = (pointer)0x0;
    r.terminator._M_string_length._0_1_ = 0;
    std::__cxx11::string::_M_assign((string *)local_1b8);
    std::__cxx11::string::_M_assign((string *)(r.id.field_2._M_local_buf + 8));
    std::__cxx11::string::_M_assign((string *)(r.clazz.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)(parentName.field_2._M_local_buf + 8),"count",
               (allocator *)(id.field_2._M_local_buf + 0xf));
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::find(&object->_M_t,(key_type *)((long)&parentName.field_2 + 8));
    std::__cxx11::string::~string((string *)(parentName.field_2._M_local_buf + 8));
    if ((_Rb_tree_header *)cVar1._M_node == &(object->_M_t)._M_impl.super__Rb_tree_header) {
      v.stringValue.field_2._8_8_ = 0;
LAB_00112dd7:
      parentName.field_2._8_8_ = &v.stringValue._M_string_length;
      v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 1;
      v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      v.numberValue = 0.0;
      v.stringValue._M_string_length._0_1_ = 0;
      v.stringValue._M_dataplus._M_p = (pointer)0x0;
      this_00 = (Value *)((long)&parentName.field_2 + 8);
      Value::operator=((Value *)((long)&r.parentId.field_2 + 8),this_00);
      Value::~Value(this_00);
      findStringInObject((string *)((long)&parentName.field_2 + 8),object,"initializor");
      std::__cxx11::string::operator=
                ((string *)&r.count.type,(string *)(parentName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(parentName.field_2._M_local_buf + 8));
      findStringInObject((string *)((long)&parentName.field_2 + 8),object,"terminator");
      std::__cxx11::string::operator=
                ((string *)(r.initializor.field_2._M_local_buf + 8),
                 (string *)(parentName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(parentName.field_2._M_local_buf + 8));
      if (this->m_verbose == true) {
        poVar3 = std::operator<<((ostream *)&std::cerr," - replicator, id=");
        poVar3 = std::operator<<(poVar3,(string *)(className.field_2._M_local_buf + 8));
        std::operator<<(poVar3,": ");
        poVar3 = std::ostream::_M_insert<double>((double)r.count.stringValue.field_2._8_8_);
        poVar3 = std::operator<<(poVar3,"x \'");
        poVar3 = std::operator<<(poVar3,(string *)&v.type);
        poVar3 = std::operator<<(poVar3,"\' under parent=");
        poVar3 = std::operator<<(poVar3,(string *)(r.terminator.field_2._M_local_buf + 8));
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      bVar4 = true;
      std::vector<Replicator,_std::allocator<Replicator>_>::push_back
                (&clazz->replicators,(value_type *)local_1b8);
    }
    else {
      if (cVar1._M_node[2]._M_color == 2) {
        pdVar2 = picojson::value::get<double>((value *)(cVar1._M_node + 2));
        v.stringValue.field_2._8_8_ = *pdVar2;
        goto LAB_00112dd7;
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,"error: malformed value for replicator id=");
      poVar3 = std::operator<<(poVar3,(string *)(className.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3,", in class=");
      poVar3 = std::operator<<(poVar3,(string *)&v.type);
      std::endl<char,std::char_traits<char>>(poVar3);
      bVar4 = false;
    }
    Replicator::~Replicator((Replicator *)local_1b8);
  }
  std::__cxx11::string::~string((string *)(r.terminator.field_2._M_local_buf + 8));
LAB_00112f5a:
  std::__cxx11::string::~string((string *)&v.type);
  std::__cxx11::string::~string((string *)(className.field_2._M_local_buf + 8));
  return bVar4;
}

Assistant:

bool ObjectModelBuilder::buildReplicator(const picojson::object &object, Class *clazz)
{
    std::string id = uniqueIdentifier(clazz, findStringInObject(object, "id"));
    std::string className = findStringInObject(object, "class");
    if (className.empty()) {
        std::cerr << "error: 'replciator' missing 'class' tag, id=" << id << std::endl;
        return false;
    }
    std::string parentName = findStringInObject(object, "parent");
    if (parentName.empty()) {
        std::cerr << "error: 'replciator' missing 'parent' tag, id=" << id << std::endl;
        return false;
    }

    Replicator r;
    r.id = id;
    r.clazz = className;
    r.parentId = parentName;

    auto countIt = object.find("count");
    if (countIt != object.end()) {
        const picojson::value &countValue = countIt->second;
        if (countValue.is<double>()) {
            r.count = Value::number(countValue.get<double>());
        } else {
            std::cerr << "error: malformed value for replicator id=" << id << ", in class=" << className << std::endl;
            return false;
        }
    } else {
        r.count = Value::number(0);
    }

    r.initializor = findStringInObject(object, "initializor");
    r.terminator = findStringInObject(object, "terminator");

    if (m_verbose) {
        std::cerr << " - replicator, id=" << id << ": " << r.count.numberValue << "x '" << className << "' under parent=" << parentName << std::endl;
    }

    clazz->replicators.push_back(r);

    return true;
}